

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O1

void __thiscall icu_63::RBBIDataWrapper::~RBBIDataWrapper(RBBIDataWrapper *this)

{
  utrie2_close_63(this->fTrie);
  this->fTrie = (UTrie2 *)0x0;
  if (this->fUDataMem == (UDataMemory *)0x0) {
    if (this->fDontFreeData == '\0') {
      uprv_free_63(this->fHeader);
    }
  }
  else {
    udata_close_63(this->fUDataMem);
  }
  UnicodeString::~UnicodeString(&this->fRuleString);
  return;
}

Assistant:

RBBIDataWrapper::~RBBIDataWrapper() {
    U_ASSERT(fRefCount == 0);
    utrie2_close(fTrie);
    fTrie = NULL;
    if (fUDataMem) {
        udata_close(fUDataMem);
    } else if (!fDontFreeData) {
        uprv_free((void *)fHeader);
    }
}